

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrapper-api.c
# Opt level: O3

int tlv_parse_interest(uint8_t *buf,size_t buflen,int argc,...)

{
  uint8_t *puVar1;
  char in_AL;
  int iVar2;
  uint8_t *puVar3;
  undefined4 *puVar4;
  int *piVar5;
  byte *pbVar6;
  undefined8 *puVar7;
  uint64_t *puVar8;
  uint8_t *puVar9;
  byte bVar10;
  uint uVar11;
  undefined8 in_RCX;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  long lVar16;
  undefined8 in_R8;
  undefined8 in_R9;
  uint64_t *puVar17;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_128 [24];
  undefined8 local_110;
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  uint8_t *local_70;
  undefined8 local_68;
  uint64_t *local_60;
  ndn_hmac_key_t *local_58;
  uint32_t local_50;
  uint local_4c;
  uint32_t block_type;
  uint32_t block_len;
  va_list vl;
  
  if (in_AL != '\0') {
    local_f8 = in_XMM0_Qa;
    local_e8 = in_XMM1_Qa;
    local_d8 = in_XMM2_Qa;
    local_c8 = in_XMM3_Qa;
    local_b8 = in_XMM4_Qa;
    local_a8 = in_XMM5_Qa;
    local_98 = in_XMM6_Qa;
    local_88 = in_XMM7_Qa;
  }
  local_110 = in_RCX;
  local_108 = in_R8;
  local_100 = in_R9;
  puVar3 = tlv_get_type_length(buf,buflen,&local_50,&local_4c);
  if (puVar3 == (uint8_t *)0x0) {
    iVar2 = -0xe;
  }
  else {
    iVar2 = -0xc;
    if (local_50 == 5) {
      local_70 = buf + buflen;
      iVar2 = -0xd;
      if ((puVar3 + local_4c == local_70) &&
         (iVar2 = ndn_interest_from_block(&tlv_parse_interest::interest,buf,(uint32_t)buflen),
         iVar2 == 0)) {
        vl[0].overflow_arg_area = local_128;
        vl[0]._0_8_ = &stack0x00000008;
        _block_type = 0x3000000018;
        iVar15 = 0;
        if (argc < 1) {
          puVar17 = (uint64_t *)0x0;
          local_60 = (uint64_t *)0x0;
          local_58 = (ndn_hmac_key_t *)0x0;
          local_68 = 0;
        }
        else {
          local_68 = 0;
          local_58 = (ndn_hmac_key_t *)0x0;
          local_60 = (uint64_t *)0x0;
          puVar17 = (uint64_t *)0x0;
          do {
            uVar13 = _block_type & 0xffffffff;
            if (uVar13 < 0x29) {
              puVar4 = (undefined4 *)(uVar13 + (long)vl[0].overflow_arg_area);
              uVar13 = (ulong)(block_type + 8);
              _block_type = CONCAT44(block_len,block_type + 8);
            }
            else {
              puVar4 = (undefined4 *)vl[0]._0_8_;
              vl[0]._0_8_ = vl[0]._0_8_ + 8;
            }
            iVar2 = -0x12;
            uVar11 = (uint)uVar13;
            switch(*puVar4) {
            case 0:
              if (uVar11 < 0x29) {
                _block_type = CONCAT44(block_len,uVar11 + 8);
                puVar7 = (undefined8 *)(uVar13 + (long)vl[0].overflow_arg_area);
              }
              else {
                puVar7 = (undefined8 *)vl[0]._0_8_;
                vl[0]._0_8_ = vl[0]._0_8_ + 8;
              }
              if ((void *)*puVar7 == (void *)0x0) goto LAB_00112985;
              memcpy((void *)*puVar7,&tlv_parse_interest::interest,0x1bc);
              break;
            case 1:
              if (uVar11 < 0x29) {
                _block_type = CONCAT44(block_len,uVar11 + 8);
                puVar7 = (undefined8 *)(uVar13 + (long)vl[0].overflow_arg_area);
              }
              else {
                puVar7 = (undefined8 *)vl[0]._0_8_;
                vl[0]._0_8_ = vl[0]._0_8_ + 8;
              }
              puVar8 = (uint64_t *)*puVar7;
              puVar17 = puVar8;
              goto joined_r0x0011282c;
            case 2:
              if (uVar11 < 0x29) {
                _block_type = CONCAT44(block_len,uVar11 + 8);
                puVar7 = (undefined8 *)(uVar13 + (long)vl[0].overflow_arg_area);
              }
              else {
                puVar7 = (undefined8 *)vl[0]._0_8_;
                vl[0]._0_8_ = vl[0]._0_8_ + 8;
              }
              puVar8 = (uint64_t *)*puVar7;
              if (puVar8 != (uint64_t *)0x0) {
                if (tlv_parse_interest::interest.name.components_size == 0) {
                  return -0x11;
                }
                uVar12 = (ulong)(tlv_parse_interest::interest.name.components_size - 1);
                uVar13 = 0xffffffffffffffff;
                if (((tlv_parse_interest::interest.name.components[uVar12].type == 8) &&
                    (uVar14 = (ulong)tlv_parse_interest::interest.name.components[uVar12].size,
                    1 < uVar14)) &&
                   (tlv_parse_interest::interest.name.components[uVar12].value[0] == '\0')) {
                  lVar16 = 0;
                  uVar13 = 0;
                  do {
                    uVar13 = uVar13 << 8 | (ulong)*(byte *)(uVar12 * 0x2c + 0x135945 + lVar16);
                    lVar16 = lVar16 + 1;
                  } while (uVar14 - 1 != lVar16);
                }
                goto LAB_0011276e;
              }
              goto LAB_00112985;
            case 3:
              if (uVar11 < 0x29) {
                _block_type = CONCAT44(block_len,uVar11 + 8);
                puVar7 = (undefined8 *)(uVar13 + (long)vl[0].overflow_arg_area);
              }
              else {
                puVar7 = (undefined8 *)vl[0]._0_8_;
                vl[0]._0_8_ = vl[0]._0_8_ + 8;
              }
              pbVar6 = (byte *)*puVar7;
              bVar10 = tlv_parse_interest::interest.flags;
              if (pbVar6 != (byte *)0x0) goto LAB_001127ed;
              goto LAB_00112985;
            case 4:
              if (uVar11 < 0x29) {
                _block_type = CONCAT44(block_len,uVar11 + 8);
                puVar7 = (undefined8 *)(uVar13 + (long)vl[0].overflow_arg_area);
              }
              else {
                puVar7 = (undefined8 *)vl[0]._0_8_;
                vl[0]._0_8_ = vl[0]._0_8_ + 8;
              }
              pbVar6 = (byte *)*puVar7;
              if (pbVar6 == (byte *)0x0) goto LAB_00112985;
              bVar10 = tlv_parse_interest::interest.flags >> 1;
LAB_001127ed:
              bVar10 = bVar10 & 1;
LAB_001127f0:
              *pbVar6 = bVar10;
              break;
            case 5:
              if (uVar11 < 0x29) {
                _block_type = CONCAT44(block_len,uVar11 + 8);
                puVar7 = (undefined8 *)(uVar13 + (long)vl[0].overflow_arg_area);
              }
              else {
                puVar7 = (undefined8 *)vl[0]._0_8_;
                vl[0]._0_8_ = vl[0]._0_8_ + 8;
              }
              puVar8 = (uint64_t *)*puVar7;
              uVar13 = tlv_parse_interest::interest.lifetime;
              if (puVar8 == (uint64_t *)0x0) goto LAB_00112985;
LAB_0011276e:
              *puVar8 = uVar13;
              break;
            case 6:
              if (uVar11 < 0x29) {
                _block_type = CONCAT44(block_len,uVar11 + 8);
                puVar7 = (undefined8 *)(uVar13 + (long)vl[0].overflow_arg_area);
              }
              else {
                puVar7 = (undefined8 *)vl[0]._0_8_;
                vl[0]._0_8_ = vl[0]._0_8_ + 8;
              }
              pbVar6 = (byte *)*puVar7;
              if (pbVar6 == (byte *)0x0) goto LAB_00112985;
              bVar10 = tlv_parse_interest::interest.hop_limit;
              if ((tlv_parse_interest::interest.flags & 4) != 0) goto LAB_001127f0;
LAB_00112815:
              *pbVar6 = 0xff;
              break;
            case 7:
              if (uVar11 < 0x29) {
                _block_type = CONCAT44(block_len,uVar11 + 8);
                puVar7 = (undefined8 *)(uVar13 + (long)vl[0].overflow_arg_area);
              }
              else {
                puVar7 = (undefined8 *)vl[0]._0_8_;
                vl[0]._0_8_ = vl[0]._0_8_ + 8;
              }
              puVar8 = (uint64_t *)*puVar7;
              local_60 = puVar8;
joined_r0x0011282c:
              if (puVar8 == (uint64_t *)0x0) goto LAB_00112985;
LAB_00112836:
              *puVar8 = 0;
              break;
            case 8:
              if (uVar11 < 0x29) {
                _block_type = CONCAT44(block_len,uVar11 + 8);
                puVar7 = (undefined8 *)(uVar13 + (long)vl[0].overflow_arg_area);
              }
              else {
                puVar7 = (undefined8 *)vl[0]._0_8_;
                vl[0]._0_8_ = vl[0]._0_8_ + 8;
              }
              puVar8 = (uint64_t *)*puVar7;
              if (puVar8 != (uint64_t *)0x0) {
                if ((tlv_parse_interest::interest.flags & 0x40) != 0) {
                  uVar13 = (ulong)tlv_parse_interest::interest.parameters.size;
                  goto LAB_0011276e;
                }
                goto LAB_00112836;
              }
              goto LAB_00112985;
            case 9:
              if (uVar11 < 0x29) {
                _block_type = CONCAT44(block_len,uVar11 + 8);
                puVar7 = (undefined8 *)(uVar13 + (long)vl[0].overflow_arg_area);
              }
              else {
                puVar7 = (undefined8 *)vl[0]._0_8_;
                vl[0]._0_8_ = vl[0]._0_8_ + 8;
              }
              pbVar6 = (byte *)*puVar7;
              if (pbVar6 != (byte *)0x0) {
                bVar10 = tlv_parse_interest::interest.signature.sig_type;
                if (-1 < (char)tlv_parse_interest::interest.flags) goto LAB_00112815;
                goto LAB_001127f0;
              }
              goto LAB_00112985;
            default:
              goto switchD_001124eb_caseD_a;
            case 0xb:
              if (uVar11 < 0x29) {
                _block_type = CONCAT44(block_len,uVar11 + 8);
                puVar7 = (undefined8 *)(uVar13 + (long)vl[0].overflow_arg_area);
              }
              else {
                puVar7 = (undefined8 *)vl[0]._0_8_;
                vl[0]._0_8_ = vl[0]._0_8_ + 8;
              }
              local_58 = (ndn_hmac_key_t *)*puVar7;
              break;
            case 0xc:
              if (uVar11 < 0x29) {
                _block_type = CONCAT44(block_len,uVar11 + 8);
                piVar5 = (int *)(uVar13 + (long)vl[0].overflow_arg_area);
              }
              else {
                piVar5 = (int *)vl[0]._0_8_;
                vl[0]._0_8_ = vl[0]._0_8_ + 8;
              }
              local_68 = CONCAT71((int7)((ulong)piVar5 >> 8),*piVar5 != 0);
            }
            iVar15 = iVar15 + 1;
          } while (iVar15 < argc);
        }
        puVar9 = tlv_get_type_length(puVar3,(long)local_70 - (long)puVar3,&local_50,&local_4c);
        puVar1 = local_70;
        iVar2 = -0x11;
        if (local_50 == 7) {
          if (puVar17 != (uint64_t *)0x0) {
            *puVar17 = (uint64_t)puVar3;
          }
          if (((local_60 != (uint64_t *)0x0) && ((tlv_parse_interest::interest.flags & 0x40) != 0))
             && (tlv_parse_interest::interest.parameters.size != 0)) {
            puVar9 = puVar9 + local_4c;
            do {
              puVar3 = tlv_get_type_length(puVar9,(long)puVar1 - (long)puVar9,&local_50,&local_4c);
              if (local_50 == 0x24) break;
              puVar9 = puVar3 + local_4c;
            } while (puVar9 < puVar1);
            *local_60 = (uint64_t)puVar3;
          }
          iVar2 = 0;
          if (((byte)local_68 & (char)tlv_parse_interest::interest.flags < '\0') == 1) {
            if (tlv_parse_interest::interest.signature.sig_type == '\x04') {
              if (local_58 != (ndn_hmac_key_t *)0x0) {
                iVar2 = ndn_signed_interest_hmac_verify(&tlv_parse_interest::interest,local_58);
                return iVar2;
              }
            }
            else {
              if (tlv_parse_interest::interest.signature.sig_type != '\x03') {
                if (tlv_parse_interest::interest.signature.sig_type != '\0') {
                  return -0x1a;
                }
                iVar2 = ndn_signed_interest_digest_verify(&tlv_parse_interest::interest);
                return iVar2;
              }
              if (local_58 != (ndn_hmac_key_t *)0x0) {
                iVar2 = ndn_signed_interest_ecdsa_verify
                                  (&tlv_parse_interest::interest,(ndn_ecc_pub_t *)local_58);
                return iVar2;
              }
            }
LAB_00112985:
            iVar2 = -0x10;
          }
        }
      }
    }
  }
switchD_001124eb_caseD_a:
  return iVar2;
}

Assistant:

int
tlv_parse_interest(uint8_t* buf, size_t buflen, int argc, ...)
{
  static ndn_interest_t interest;
  va_list vl;
  int i, ret = NDN_SUCCESS;
  enum TLV_INTARG_TYPE argtype;
  uint32_t block_type, block_len;
  uint8_t *ptr, *valptr, *end = buf + buflen;
  uint8_t **namebuf_ptr = NULL;
  uint8_t **params_ptr = NULL;
  void *arg_ptr = NULL;
  void *key_ptr = NULL;
  bool verify_sig = false;

  // Check type and length
  ptr = tlv_get_type_length(buf, buflen, &block_type, &block_len);
  if (ptr == NULL) {
    return NDN_OVERSIZE_VAR;
  }
  if (block_type != TLV_Interest) {
    return NDN_WRONG_TLV_TYPE;
  }
  if (ptr + block_len != end) {
    return NDN_WRONG_TLV_LENGTH;
  }

  // Decode interest
  ret = ndn_interest_from_block(&interest, buf, buflen);
  if (ret != NDN_SUCCESS) {
    return ret;
  }

  // Parse args
  va_start(vl, argc);
  for (i = 0; i < argc && ret == NDN_SUCCESS; i++) {
    argtype = va_arg(vl, int);
    switch(argtype) {
      case TLV_INTARG_NAME_PTR:
        arg_ptr = va_arg(vl, ndn_name_t*);
        if (arg_ptr == NULL) {
          ret = NDN_INVALID_POINTER;
          break;
        }
        *(ndn_name_t*)arg_ptr = interest.name;
        break;

      case TLV_INTARG_NAME_BUF:
        namebuf_ptr = va_arg(vl, uint8_t**);
        if (namebuf_ptr == NULL) {
          ret = NDN_INVALID_POINTER;
          break;
        }
        *namebuf_ptr = NULL;
        break;

      case TLV_INTARG_NAME_SEGNO_U64:
        arg_ptr = va_arg(vl, uint64_t*);
        if (arg_ptr == NULL) {
          ret = NDN_INVALID_POINTER;
          break;
        }
        if (interest.name.components_size > 0) {
          *(uint64_t*)arg_ptr = tlv_decode_segno(&interest.name.components[interest.name.components_size - 1]);
        }
        else {
          ret = NDN_UNSUPPORTED_FORMAT;
        }
        break;

      case TLV_INTARG_CANBEPREFIX_BOOL:
        arg_ptr = va_arg(vl, bool*);
        if (arg_ptr == NULL) {
          ret = NDN_INVALID_POINTER;
          break;
        }
        *(bool*)arg_ptr = ndn_interest_get_CanBePrefix(&interest);
        break;

      case TLV_INTARG_MUSTBEFRESH_BOOL:
        arg_ptr = va_arg(vl, bool*);
        if (arg_ptr == NULL) {
          ret = NDN_INVALID_POINTER;
          break;
        }
        *(bool*)arg_ptr = ndn_interest_get_MustBeFresh(&interest);
        break;

      case TLV_INTARG_LIFETIME_U64:
        arg_ptr = va_arg(vl, uint64_t*);
        if (arg_ptr == NULL) {
          ret = NDN_INVALID_POINTER;
          break;
        }
        *(uint64_t*)arg_ptr = interest.lifetime;
        break;

      case TLV_INTARG_HOTLIMIT_U8:
        arg_ptr = va_arg(vl, uint8_t*);
        if (arg_ptr == NULL) {
          ret = NDN_INVALID_POINTER;
          break;
        }
        if (ndn_interest_has_HopLimit(&interest)) {
          *(uint8_t*)arg_ptr = interest.hop_limit;
        }
        else {
          *(uint8_t*)arg_ptr = 0xFF;
        }
        break;

      case TLV_INTARG_PARAMS_BUF:
        params_ptr = va_arg(vl, uint8_t**);
        if (params_ptr == NULL) {
          ret = NDN_INVALID_POINTER;
          break;
        }
        *params_ptr = NULL;
        break;

      case TLV_INTARG_PARAMS_SIZE:
        arg_ptr = va_arg(vl, size_t*);
        if (arg_ptr == NULL) {
          ret = NDN_INVALID_POINTER;
          break;
        }
        if (ndn_interest_has_Parameters(&interest)) {
          *(size_t*)arg_ptr = (size_t)interest.parameters.size;
        }
        else {
          *(size_t*)arg_ptr = 0;
        }
        break;

      case TLV_INTARG_SIGTYPE_U8:
        arg_ptr = va_arg(vl, uint8_t*);
        if (arg_ptr == NULL) {
          ret = NDN_INVALID_POINTER;
          break;
        }
        if (ndn_interest_is_signed(&interest)) {
          *(uint8_t*)arg_ptr = interest.signature.sig_type;
        }
        else {
          *(uint8_t*)arg_ptr = (uint8_t)-1;
        }
        break;

      case TLV_INTARG_SIGKEY_PTR:
        key_ptr = va_arg(vl, void*);
        break;

      case TLV_INTARG_VERIFY:
        verify_sig = va_arg(vl, uint32_t);
        break;

      default:
        ret = NDN_INVALID_ARG;
        break;
    }
  }
  va_end(vl);
  if (ret != NDN_SUCCESS) {
    return ret;
  }

  // Decode Name (No need to check for NULL since decoding succeeded)
  valptr = tlv_get_type_length(ptr, end - ptr, &block_type, &block_len);
  if (block_type != TLV_Name) {
    return NDN_UNSUPPORTED_FORMAT;
  }
  if (namebuf_ptr != NULL) {
    *namebuf_ptr = ptr;
  }
  ptr = valptr + block_len;

  // Content if applicable
  if (params_ptr && ndn_interest_has_Parameters(&interest) && interest.parameters.size > 0) {
    do {
      valptr = tlv_get_type_length(ptr, end - ptr, &block_type, &block_len);
      ptr = valptr + block_len;
    } while (block_type != TLV_ApplicationParameters && ptr < end);
    *params_ptr = valptr;
  }

  // Verify if required
  if (verify_sig && ndn_interest_is_signed(&interest)) {
    switch(interest.signature.sig_type) {
      case NDN_SIG_TYPE_DIGEST_SHA256:
        ret = ndn_signed_interest_digest_verify(&interest);
        break;

      case NDN_SIG_TYPE_ECDSA_SHA256:
        if (key_ptr == NULL) {
          ret = NDN_INVALID_POINTER;
        }
        else {
          ret = ndn_signed_interest_ecdsa_verify(&interest, (ndn_ecc_pub_t*)key_ptr);
        }
        break;

      case NDN_SIG_TYPE_HMAC_SHA256:
        if (key_ptr == NULL) {
          ret = NDN_INVALID_POINTER;
        }
        else {
          ret = ndn_signed_interest_hmac_verify(&interest, (ndn_hmac_key_t*)key_ptr);
        }
        break;

      default:
        ret = NDN_SEC_UNSUPPORT_SIGN_TYPE;
        break;
    }
  }

  return ret;
}